

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.cc
# Opt level: O2

void LEARNER::process_example(vw *all,example *ec)

{
  bool bVar1;
  
  if ((ulong)((long)(ec->super_example_predict).indices._end -
             (long)(ec->super_example_predict).indices._begin) < 2) {
    if (ec->end_pass == true) {
      dispatch_end_pass(all,ec);
      return;
    }
    bVar1 = is_save_cmd(ec);
    if (bVar1) {
      save(all,ec);
      return;
    }
  }
  dispatch_example(all,ec);
  return;
}

Assistant:

void process_example(vw& all, example* ec)
{
  if (ec->indices.size() > 1)  // 1+ nonconstant feature. (most common case first)
    dispatch_example(all, *ec);
  else if (ec->end_pass)
    dispatch_end_pass(all, *ec);
  else if (is_save_cmd(ec))
    save(all, ec);
  else
    dispatch_example(all, *ec);
}